

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_protocol_handle_send_fragment
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  enet_uint8 *peVar7;
  ENetIncomingCommand *pEVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  ENetChannel *channel;
  ENetProtocol hostCommand;
  ENetProtocol local_68;
  ulong dataLength;
  
  iVar10 = -1;
  if (((ulong)(command->header).channelID < peer->channelCount) &&
     (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
    uVar2 = (command->acknowledge).receivedSentTime;
    uVar5 = uVar2 << 8 | uVar2 >> 8;
    peVar7 = *currentData + uVar5;
    *currentData = peVar7;
    if ((uVar2 != 0) &&
       ((((ulong)uVar5 <= host->maximumPacketSize && (host->receivedData <= peVar7)) &&
        (peVar7 <= host->receivedData + host->receivedDataLength)))) {
      uVar4 = (command->acknowledge).receivedReliableSequenceNumber << 8;
      uVar6 = uVar4 | (command->acknowledge).receivedReliableSequenceNumber >> 8;
      uVar12 = (ulong)((uint)(command->header).channelID * 0x50);
      uVar4 = uVar4 >> 0xc;
      uVar2 = *(ushort *)((long)peer->channels->reliableWindows + uVar12 + 0x20);
      uVar13 = uVar4 + 0x10;
      if (uVar2 <= uVar6) {
        uVar13 = uVar4;
      }
      if ((uVar2 >> 0xc <= uVar13) && (uVar13 < (ushort)((uVar2 >> 0xc) + 7))) {
        uVar14 = (command->connect).mtu;
        uVar3 = (command->connect).windowSize;
        uVar11 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        if (uVar14 <= uVar11 || 0x100000 < uVar14) {
          return -1;
        }
        uVar9 = (command->connect).incomingBandwidth;
        uVar15 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        uVar9 = (command->connect).channelCount;
        uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        dataLength = (ulong)uVar9;
        if (uVar9 - uVar15 < (uint)uVar5) {
          return -1;
        }
        if (uVar9 <= uVar15) {
          return -1;
        }
        if (uVar9 < uVar14) {
          return -1;
        }
        if (host->maximumPacketSize < dataLength) {
          return -1;
        }
        channel = (ENetChannel *)((long)peer->channels->reliableWindows + (uVar12 - 6));
        for (pEVar8 = (ENetIncomingCommand *)(channel->incomingReliableCommands).sentinel.previous;
            pEVar8 != (ENetIncomingCommand *)&channel->incomingReliableCommands;
            pEVar8 = (ENetIncomingCommand *)(pEVar8->incomingCommandList).previous) {
          uVar4 = pEVar8->reliableSequenceNumber;
          if (uVar6 < uVar2) {
            if (uVar2 <= uVar4) break;
            if (uVar4 <= uVar6) {
LAB_00108602:
              if (uVar6 <= uVar4) {
                if (((pEVar8->command).header.command & 0xf) != 8) {
                  return -1;
                }
                if (pEVar8->packet->dataLength != dataLength) {
                  return -1;
                }
                if (uVar14 != pEVar8->fragmentCount) {
                  return -1;
                }
                goto LAB_00108645;
              }
              break;
            }
          }
          else if (uVar4 <= uVar6 && uVar2 <= uVar4) goto LAB_00108602;
        }
        local_68._8_4_ = *(enet_uint32 *)((long)command + 8);
        local_68._12_4_ = *(enet_uint32 *)((long)command + 0xc);
        local_68._16_4_ = *(enet_uint32 *)((long)command + 0x10);
        local_68._20_4_ = *(enet_uint32 *)((long)command + 0x14);
        local_68._24_4_ = *(enet_uint32 *)((long)command + 0x18);
        local_68._28_4_ = *(enet_uint32 *)((long)command + 0x1c);
        local_68._32_4_ = *(enet_uint32 *)((long)command + 0x20);
        local_68._36_4_ = *(enet_uint32 *)((long)command + 0x24);
        local_68._40_4_ = *(enet_uint32 *)((long)command + 0x28);
        local_68._44_4_ = *(enet_uint32 *)((long)command + 0x2c);
        local_68.disconnect.data = (command->disconnect).data;
        local_68._0_2_ = (command->disconnect).header;
        local_68.header.reliableSequenceNumber = uVar6;
        pEVar8 = enet_peer_queue_incoming_command(peer,&local_68,(void *)0x0,dataLength,1,uVar14);
        if (pEVar8 == (ENetIncomingCommand *)0x0) {
          return -1;
        }
LAB_00108645:
        uVar11 = uVar11 >> 5;
        if ((pEVar8->fragments[uVar11] >> (uVar3 >> 0x18 & 0x1f) & 1) == 0) {
          pEVar8->fragmentsRemaining = pEVar8->fragmentsRemaining - 1;
          puVar1 = pEVar8->fragments + uVar11;
          *puVar1 = *puVar1 | 1 << ((byte)(uVar3 >> 0x18) & 0x1f);
          uVar12 = pEVar8->packet->dataLength;
          uVar14 = (int)uVar12 - uVar15;
          if (uVar15 + uVar5 <= uVar12) {
            uVar14 = (uint)uVar5;
          }
          memcpy(pEVar8->packet->data + uVar15,&(command->connect).outgoingBandwidth,(ulong)uVar14);
          if (pEVar8->fragmentsRemaining != 0) {
            return 0;
          }
          enet_peer_dispatch_incoming_reliable_commands(peer,channel,(ENetIncomingCommand *)0x0);
          return 0;
        }
      }
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

static int enet_protocol_handle_send_fragment(ENetHost *host, ENetPeer *peer, const ENetProtocol *command, enet_uint8 **currentData) {
        enet_uint32 fragmentNumber, fragmentCount, fragmentOffset, fragmentLength, startSequenceNumber, totalLength;
        ENetChannel *channel;
        enet_uint16 startWindow, currentWindow;
        ENetListIterator currentCommand;
        ENetIncomingCommand *startCommand = NULL;

        if (command->header.channelID >= peer->channelCount || (peer->state != ENET_PEER_STATE_CONNECTED && peer->state != ENET_PEER_STATE_DISCONNECT_LATER)) {
            return -1;
        }

        fragmentLength = ENET_NET_TO_HOST_16(command->sendFragment.dataLength);
        *currentData  += fragmentLength;
        if (fragmentLength <= 0 ||
            fragmentLength > host->maximumPacketSize ||
            *currentData < host->receivedData ||
            *currentData > &host->receivedData[host->receivedDataLength]
        ) {
            return -1;
        }

        channel = &peer->channels[command->header.channelID];
        startSequenceNumber = ENET_NET_TO_HOST_16(command->sendFragment.startSequenceNumber);
        startWindow         = startSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
        currentWindow       = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (startSequenceNumber < channel->incomingReliableSequenceNumber) {
            startWindow += ENET_PEER_RELIABLE_WINDOWS;
        }

        if (startWindow < currentWindow || startWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1) {
            return 0;
        }

        fragmentNumber = ENET_NET_TO_HOST_32(command->sendFragment.fragmentNumber);
        fragmentCount  = ENET_NET_TO_HOST_32(command->sendFragment.fragmentCount);
        fragmentOffset = ENET_NET_TO_HOST_32(command->sendFragment.fragmentOffset);
        totalLength    = ENET_NET_TO_HOST_32(command->sendFragment.totalLength);

        if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT ||
            fragmentNumber >= fragmentCount ||
            totalLength > host->maximumPacketSize ||
            totalLength < fragmentCount ||
            fragmentOffset >= totalLength ||
            fragmentLength > totalLength - fragmentOffset
        ) {
            return -1;
        }

        for (currentCommand = enet_list_previous(enet_list_end(&channel->incomingReliableCommands));
            currentCommand != enet_list_end(&channel->incomingReliableCommands);
            currentCommand = enet_list_previous(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (startSequenceNumber >= channel->incomingReliableSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                    continue;
                }
            } else if (incomingCommand->reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber <= startSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < startSequenceNumber) {
                    break;
                }

                if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) !=
                    ENET_PROTOCOL_COMMAND_SEND_FRAGMENT ||
                    totalLength != incomingCommand->packet->dataLength ||
                    fragmentCount != incomingCommand->fragmentCount
                ) {
                    return -1;
                }

                startCommand = incomingCommand;
                break;
            }
        }

        if (startCommand == NULL) {
            ENetProtocol hostCommand = *command;
            hostCommand.header.reliableSequenceNumber = startSequenceNumber;
            startCommand = enet_peer_queue_incoming_command(peer, &hostCommand, NULL, totalLength, ENET_PACKET_FLAG_RELIABLE, fragmentCount);
            if (startCommand == NULL) {
                return -1;
            }
        }

        if ((startCommand->fragments[fragmentNumber / 32] & (1u << (fragmentNumber % 32))) == 0) {
            --startCommand->fragmentsRemaining;
            startCommand->fragments[fragmentNumber / 32] |= (1u << (fragmentNumber % 32));

            if (fragmentOffset + fragmentLength > startCommand->packet->dataLength) {
                fragmentLength = startCommand->packet->dataLength - fragmentOffset;
            }

            memcpy(startCommand->packet->data + fragmentOffset, (enet_uint8 *) command + sizeof(ENetProtocolSendFragment), fragmentLength);

            if (startCommand->fragmentsRemaining <= 0) {
                enet_peer_dispatch_incoming_reliable_commands(peer, channel, NULL);
            }
        }

        return 0;
    }